

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

void __thiscall
Imf_3_3::Context::Context
          (Context *this,char *filename,ContextInitializer *ctxtinit,temp_mode_t param_4)

{
  exr_result_t eVar1;
  InputExc *this_00;
  __shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffffe28;
  Context *in_stack_fffffffffffffe30;
  stringstream local_1b8 [16];
  ostream local_1a8 [96];
  exr_context_initializer_t *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  exr_context_t *in_stack_fffffffffffffec8;
  
  Context(in_stack_fffffffffffffe30);
  std::__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>::get(in_RDI);
  eVar1 = exr_start_temporary_context
                    (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"Unable to create a temporary context");
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::InputExc::InputExc(this_00,in_stack_fffffffffffffe28);
    __cxa_throw(this_00,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
  }
  return;
}

Assistant:

Context::Context (const char* filename, const ContextInitializer& ctxtinit, temp_mode_t)
    : Context()
{
    if (EXR_ERR_SUCCESS != exr_start_temporary_context (
                               _ctxt.get (),
                               filename,
                               &(ctxtinit._initializer)))
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "Unable to create a temporary context");
    }
}